

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_hash_table.cpp
# Opt level: O0

uint __thiscall ON_Hash32Table::RemoveAllItems(ON_Hash32Table *this,ON_FixedSizePool *fsp)

{
  ON_Hash32TableItem *pOVar1;
  size_t __n;
  size_t sVar2;
  ON_Hash32TableItem *next;
  ON_Hash32TableItem *p;
  ON__UINT32 i;
  bool bReturnItem;
  uint removed_item_count;
  size_t fsp_item_count;
  size_t sizeof_item;
  ON_FixedSizePool *fsp_local;
  ON_Hash32Table *this_local;
  
  __n = ON_FixedSizePool::SizeofElement(fsp);
  sVar2 = ON_FixedSizePool::ActiveElementCount(fsp);
  if ((__n < 0x10) || (sVar2 < this->m_item_count)) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_hash_table.cpp"
               ,0x10c,"","Invalid fsp parameter.");
    this_local._4_4_ = RemoveAllItems(this);
  }
  else {
    i = 0;
    if (this->m_item_count != 0) {
      if (sVar2 == this->m_item_count) {
        for (p._4_4_ = 0; p._4_4_ < this->m_hash_table_capacity; p._4_4_ = p._4_4_ + 1) {
          next = this->m_hash_table[p._4_4_];
          if (next != (ON_Hash32TableItem *)0x0) {
            this->m_hash_table[p._4_4_] = (ON_Hash32TableItem *)0x0;
            while (next != (ON_Hash32TableItem *)0x0) {
              pOVar1 = next->m_internal_next;
              memset(next,0,__n);
              ON_FixedSizePool::ReturnElement(fsp,next);
              i = i + 1;
              next = pOVar1;
            }
          }
        }
      }
      else {
        i = RemoveAllItems(this);
        ON_FixedSizePool::ReturnAll(fsp);
      }
    }
    if (i != this->m_item_count) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_hash_table.cpp"
                 ,0x12f,"","Corrupt hash table.");
    }
    this->m_item_count = 0;
    this_local._4_4_ = i;
  }
  return this_local._4_4_;
}

Assistant:

unsigned int ON_Hash32Table::RemoveAllItems(
  class ON_FixedSizePool& fsp
)
{
  const size_t sizeof_item = fsp.SizeofElement();
  const size_t fsp_item_count = fsp.ActiveElementCount();
  if (sizeof_item < sizeof(ON_Hash32TableItem) || fsp_item_count < (size_t)m_item_count)
  {
    ON_ERROR("Invalid fsp parameter.");
    return RemoveAllItems();
  }

  unsigned int removed_item_count = 0;
  if (m_item_count > 0)
  {
    const bool bReturnItem = (fsp_item_count == (size_t)m_item_count);
    if (false == bReturnItem)
    {
      removed_item_count = RemoveAllItems();
      fsp.ReturnAll();
    }
    else
    {
      for (ON__UINT32 i = 0; i < m_hash_table_capacity; i++)
      {
        ON_Hash32TableItem* p = m_hash_table[i];
        if (nullptr == p)
          continue;
        m_hash_table[i] = nullptr;
        while (nullptr != p)
        {
          ON_Hash32TableItem* next = p->m_internal_next;
          memset(p, 0, sizeof_item);
          fsp.ReturnElement(p);
          p = next;
          removed_item_count++;
        }
      }
    }
  }

  if (removed_item_count != m_item_count)
  {
    ON_ERROR("Corrupt hash table.");
  }
  m_item_count = 0;
  return removed_item_count;
}